

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory_tests.cc
# Opt level: O0

void __thiscall
lf::mesh::hybrid2d::test::lf_hybrid2d_IncompleteMeshes_Test::TestBody
          (lf_hybrid2d_IncompleteMeshes_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pMVar4;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar5;
  char *pcVar6;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar7;
  char *regex;
  char *regex_00;
  AssertHelper local_640;
  Message local_638 [6];
  exception *gtest_exception_1;
  ReturnSentinel local_5f8;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_5d0;
  DeathTest *gtest_dt_1;
  Scalar local_5c0;
  Scalar local_5b8;
  Scalar local_5b0;
  Matrix<double,_2,_2,_0,_2,_2> local_5a8;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_588;
  undefined1 local_568 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_560;
  array<unsigned_int,_2UL> local_558;
  span<const_unsigned_int,_18446744073709551615UL> local_550;
  RefElType local_539;
  Scalar local_538;
  Scalar local_530;
  Scalar local_528;
  Scalar local_520;
  Scalar local_518;
  Scalar local_510;
  int local_508 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_500;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_4e8;
  undefined1 local_4c8 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_4c0;
  array<unsigned_int,_3UL> local_4b4;
  span<const_unsigned_int,_18446744073709551615UL> local_4a8;
  RefElType local_491;
  int local_490 [2];
  Matrix<double,2,1,0,2,1> local_488 [24];
  undefined1 local_470 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_468;
  int local_460 [2];
  Matrix<double,2,1,0,2,1> local_458 [24];
  undefined1 local_440 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_438;
  int local_430 [2];
  Matrix<double,2,1,0,2,1> local_428 [24];
  undefined1 local_410 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_408;
  int local_400 [2];
  Matrix<double,2,1,0,2,1> local_3f8 [24];
  undefined1 local_3e0 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_3d8;
  undefined1 local_3cd;
  bool local_3cc [4];
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_3c8;
  AssertHelper local_3c0;
  Message local_3b8;
  shared_ptr<lf::mesh::Mesh> local_3b0;
  undefined1 local_3a0 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Scalar local_380;
  Scalar local_378;
  Scalar local_370;
  Scalar local_368;
  Scalar local_360;
  int local_358 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_350;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_338;
  undefined1 local_318 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_310;
  array<unsigned_int,_3UL> local_304;
  span<const_unsigned_int,_18446744073709551615UL> local_2f8;
  RefElType local_2e1;
  int local_2e0 [2];
  Matrix<double,2,1,0,2,1> local_2d8 [24];
  undefined1 local_2c0 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_2b8;
  int local_2b0 [2];
  Matrix<double,2,1,0,2,1> local_2a8 [24];
  undefined1 local_290 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_288;
  int local_280 [2];
  Matrix<double,2,1,0,2,1> local_278 [24];
  undefined1 local_260 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_258;
  int local_250 [2];
  Matrix<double,2,1,0,2,1> local_248 [16];
  undefined1 local_238 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_230;
  undefined1 local_225;
  bool local_224 [4];
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_220;
  AssertHelper local_218;
  Message local_210;
  int local_204;
  exception *gtest_exception;
  ReturnSentinel local_1c8;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_1a0;
  DeathTest *gtest_dt;
  Scalar local_190;
  Scalar local_188;
  Scalar local_180;
  Scalar local_178;
  Scalar local_170;
  int local_168 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_160;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_148;
  undefined1 local_128 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_120;
  array<unsigned_int,_3UL> local_114;
  span<const_unsigned_int,_18446744073709551615UL> local_108;
  RefElType local_f1;
  int local_f0 [2];
  Matrix<double,2,1,0,2,1> local_e8 [24];
  undefined1 local_d0 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_c8;
  int local_c0 [2];
  Matrix<double,2,1,0,2,1> local_b8 [24];
  undefined1 local_a0 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_98;
  int local_90 [2];
  Matrix<double,2,1,0,2,1> local_88 [24];
  undefined1 local_70 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_68 [3];
  int local_50 [2];
  Matrix<double,2,1,0,2,1> local_48 [24];
  undefined1 local_30 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_28;
  undefined1 local_1d;
  bool local_1c [4];
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  local_18;
  __single_object factory;
  lf_hybrid2d_IncompleteMeshes_Test *this_local;
  
  local_1c[0] = true;
  local_1c[1] = false;
  local_1c[2] = false;
  local_1c[3] = false;
  local_1d = 1;
  factory._M_t.
  super___uniq_ptr_impl<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ._M_t.
  super__Tuple_impl<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  .super__Head_base<0UL,_lf::mesh::hybrid2d::MeshFactory_*,_false>._M_head_impl =
       (__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
        )(__uniq_ptr_data<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>,_true,_true>
          )this;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int,bool>((int *)&local_18,local_1c);
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_50[1] = 0;
  local_50[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_48,local_50 + 1,local_50);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_30);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_28,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_30)
  ;
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_28);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_28);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_30)
  ;
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_90[1] = 1;
  local_90[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_88,local_90 + 1,local_90);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_70);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             local_68,(unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                      local_70);
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)local_68);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (local_68);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_70)
  ;
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_c0[1] = 0;
  local_c0[0] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_b8,local_c0 + 1,local_c0);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_a0);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_98,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_a0)
  ;
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_98);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_98);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_a0)
  ;
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_f0[1] = 1;
  local_f0[0] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_e8,local_f0 + 1,local_f0);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_d0);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_c8,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_d0)
  ;
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c8);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_c8);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_d0)
  ;
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_f1 = (RefElType)lf::base::RefEl::kTria();
  local_114._M_elems[0] = 0;
  local_114._M_elems[1] = 1;
  local_114._M_elems[2] = 2;
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_3UL>
            (&local_108,&local_114);
  local_168[1] = 2;
  local_168[0] = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_160,local_168 + 1,local_168);
  local_170 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_148,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_160,
             &local_170);
  local_178 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_148,&local_178);
  local_180 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_180);
  local_188 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_188);
  local_190 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_190);
  gtest_dt = (DeathTest *)0x3ff0000000000000;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,(Scalar *)&gtest_dt);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(pCVar5);
  std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_128);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_120,
             (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
             local_128);
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[4])
            (pMVar4,(ulong)local_f1,&local_108,
             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_120);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_120);
  std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::~unique_ptr
            ((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
             local_128);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_148);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_160);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"Mesh is incomplete",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("factory->Build()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
                       ,0xab,&local_1a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0011c88f;
    if (local_1a0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_1a0);
      iVar2 = (*local_1a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1a0->_vptr_DeathTest[4])(local_1a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0011c851;
        local_204 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_1c8,local_1a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            pMVar4 = std::
                     unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                     ::operator->(&local_18);
            (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[5])(&gtest_exception);
            std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
                      ((shared_ptr<lf::mesh::Mesh> *)&gtest_exception);
          }
          (*local_1a0->_vptr_DeathTest[5])(local_1a0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_1c8);
        }
LAB_0011c851:
        local_204 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_204 != 0) goto LAB_0011c88f;
    }
  }
  else {
LAB_0011c88f:
    testing::Message::Message(&local_210);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0xab,pcVar6);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  local_224[0] = true;
  local_224[1] = false;
  local_224[2] = false;
  local_224[3] = false;
  local_225 = 0;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int,bool>((int *)&local_220,local_224);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::operator=(&local_18,&local_220);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_220);
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_250[1] = 0;
  local_250[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_248,local_250 + 1,local_250);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_238);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_230,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_238
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_230);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_230);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_238
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_280[1] = 1;
  local_280[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_278,local_280 + 1,local_280);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_260);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_258,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_260
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_258);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_258);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_260
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_2b0[1] = 0;
  local_2b0[0] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_2a8,local_2b0 + 1,local_2b0);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_290);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_288,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_290
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_288);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_288);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_290
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_2e0[1] = 1;
  local_2e0[0] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_2d8,local_2e0 + 1,local_2e0);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_2c0);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_2b8,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_2c0
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_2b8);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_2b8);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_2c0
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_2e1 = (RefElType)lf::base::RefEl::kTria();
  local_304._M_elems[0] = 0;
  local_304._M_elems[1] = 1;
  local_304._M_elems[2] = 2;
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_3UL>
            (&local_2f8,&local_304);
  local_358[1] = 2;
  local_358[0] = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_350,local_358 + 1,local_358);
  local_360 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_338,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_350,
             &local_360);
  local_368 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_338,&local_368);
  local_370 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_370);
  local_378 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_378);
  local_380 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_380);
  gtest_fatal_failure_checker.original_reporter_ =
       (TestPartResultReporterInterface *)0x3ff0000000000000;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,(Scalar *)&gtest_fatal_failure_checker.original_reporter_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(pCVar5);
  std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_318);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_310,
             (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
             local_318);
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[4])
            (pMVar4,(ulong)local_2e1,&local_2f8,
             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_310);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_310);
  std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::~unique_ptr
            ((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
             local_318);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_338);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_350);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_3a0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      pMVar4 = std::
               unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
               ::operator->(&local_18);
      (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[5])(&local_3b0);
      std::shared_ptr<lf::mesh::Mesh>::~shared_ptr(&local_3b0);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)local_3a0);
    if (bVar1) {
      local_204 = 4;
    }
    else {
      local_204 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_3a0);
    if (local_204 != 0) goto LAB_0011d018;
  }
  else {
LAB_0011d018:
    testing::Message::Message(&local_3b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
               ,0xb7,
               "Expected: factory->Build() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message(&local_3b8);
  }
  local_3cc[0] = true;
  local_3cc[1] = false;
  local_3cc[2] = false;
  local_3cc[3] = false;
  local_3cd = 1;
  std::make_unique<lf::mesh::hybrid2d::MeshFactory,int,bool>((int *)&local_3c8,local_3cc);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::operator=(&local_18,&local_3c8);
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_3c8);
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_400[1] = 0;
  local_400[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_3f8,local_400 + 1,local_400);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_3e0);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_3d8,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_3e0
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_3d8);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_3d8);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_3e0
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_430[1] = 1;
  local_430[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_428,local_430 + 1,local_430);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_410);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_408,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_410
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_408);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_408);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_410
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_460[1] = 0;
  local_460[0] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_458,local_460 + 1,local_460);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_440);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_438,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_440
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_438);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_438);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_440
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_490[1] = 1;
  local_490[0] = 1;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>(local_488,local_490 + 1,local_490);
  std::make_unique<lf::geometry::Point,Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_2,_1,_0,_2,_1> *)local_470);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_468,
             (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_470
            );
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[3])
            (pMVar4,(unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_468);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_468);
  std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
            ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)local_470
            );
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_491 = (RefElType)lf::base::RefEl::kTria();
  local_4b4._M_elems[0] = 0;
  local_4b4._M_elems[1] = 1;
  local_4b4._M_elems[2] = 2;
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_3UL>
            (&local_4a8,&local_4b4);
  local_508[1] = 2;
  local_508[0] = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_500,local_508 + 1,local_508);
  local_510 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_4e8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_500,
             &local_510);
  local_518 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_4e8,&local_518);
  local_520 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_520);
  local_528 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_528);
  local_530 = 0.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_530);
  local_538 = 1.0;
  pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar5,&local_538);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(pCVar5);
  std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_4c8);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_4c0,
             (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
             local_4c8);
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[4])
            (pMVar4,(ulong)local_491,&local_4a8,
             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_4c0);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_4c0);
  std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::~unique_ptr
            ((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
             local_4c8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_4e8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_500);
  pMVar4 = std::
           unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
           ::operator->(&local_18);
  local_539 = (RefElType)lf::base::RefEl::kSegment();
  local_558._M_elems[0] = 2;
  local_558._M_elems[1] = 3;
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_2UL>
            (&local_550,&local_558);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&local_5a8);
  local_5b0 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator<<
            (&local_588,(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_5a8,&local_5b0);
  local_5b8 = 1.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (&local_588,&local_5b8);
  local_5c0 = 1.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar7,&local_5c0);
  gtest_dt_1 = (DeathTest *)0x3ff0000000000000;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar7,(Scalar *)&gtest_dt_1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::finished(pCVar7);
  std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,2,2,0,2,2>&>
            ((Matrix<double,_2,_2,_0,_2,_2> *)local_568);
  std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
  unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
            ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_560,
             (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_> *)
             local_568);
  (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[4])
            (pMVar4,(ulong)local_539,&local_550,
             (unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
             &local_560);
  std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::~unique_ptr
            (&local_560);
  std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
  ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_> *)
              local_568);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_588);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"Mesh is incomplete",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("factory->Build()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
                       ,0xc6,&local_5d0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_5d0 == (pointer)0x0) goto LAB_0011dcd4;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_5d0);
      iVar2 = (*local_5d0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_5d0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_5d0->_vptr_DeathTest[4])(local_5d0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0011dbf1;
        local_204 = 5;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_5f8,local_5d0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            pMVar4 = std::
                     unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
                     ::operator->(&local_18);
            (*(pMVar4->super_MeshFactory)._vptr_MeshFactory[5])(&gtest_exception_1);
            std::shared_ptr<lf::mesh::Mesh>::~shared_ptr
                      ((shared_ptr<lf::mesh::Mesh> *)&gtest_exception_1);
          }
          (*local_5d0->_vptr_DeathTest[5])(local_5d0,2);
          local_204 = 6;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_5f8);
        }
LAB_0011dbf1:
        local_204 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_204 == 0) goto LAB_0011dcd4;
    }
  }
  testing::Message::Message(local_638);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_640,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/test/mesh_factory_tests.cc"
             ,0xc6,pcVar6);
  testing::internal::AssertHelper::operator=(&local_640,local_638);
  testing::internal::AssertHelper::~AssertHelper(&local_640);
  testing::Message::~Message(local_638);
LAB_0011dcd4:
  std::
  unique_ptr<lf::mesh::hybrid2d::MeshFactory,_std::default_delete<lf::mesh::hybrid2d::MeshFactory>_>
  ::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(lf_hybrid2d, IncompleteMeshes) {
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wunused-result"
  // construct a mesh with a triangle + an additional point and make sure it
  // fails:
  auto factory = std::make_unique<MeshFactory>(2, true);
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(0, 0)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(1, 0)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(0, 1)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(1, 1)));
  factory->AddEntity(
      base::RefEl::kTria(), std::array<size_type, 3>{{0, 1, 2}},
      std::make_unique<geometry::TriaO1>(
          (Eigen::MatrixXd(2, 3) << 0, 1, 0, 0, 0, 1).finished()));

  EXPECT_DEATH(factory->Build(), "Mesh is incomplete");

  // construct the same mesh but with check_completeness = false
  factory = std::make_unique<MeshFactory>(2, false);
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(0, 0)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(1, 0)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(0, 1)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(1, 1)));
  factory->AddEntity(
      base::RefEl::kTria(), std::array<size_type, 3>{{0, 1, 2}},
      std::make_unique<geometry::TriaO1>(
          (Eigen::MatrixXd(2, 3) << 0, 1, 0, 0, 0, 1).finished()));
  EXPECT_NO_FATAL_FAILURE(factory->Build());

  // construct a mesh with a triangle + a detached edge:
  factory = std::make_unique<MeshFactory>(2, true);
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(0, 0)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(1, 0)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(0, 1)));
  factory->AddPoint(std::make_unique<geometry::Point>(Eigen::Vector2d(1, 1)));
  factory->AddEntity(
      base::RefEl::kTria(), std::array<size_type, 3>{{0, 1, 2}},
      std::make_unique<geometry::TriaO1>(
          (Eigen::MatrixXd(2, 3) << 0, 1, 0, 0, 0, 1).finished()));
  factory->AddEntity(base::RefEl::kSegment(), std::array<size_type, 2>{{2, 3}},
                     std::make_unique<geometry::SegmentO1>(
                         (Eigen::Matrix2d() << 0, 1, 1, 1).finished()));
  EXPECT_DEATH(factory->Build(), "Mesh is incomplete");
#pragma GCC diagnostic pop
}